

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

cmFileListGeneratorBase * __thiscall
cmFileListGeneratorBase::SetNext(cmFileListGeneratorBase *this,cmFileListGeneratorBase *next)

{
  pointer pcVar1;
  unique_ptr<cmFileListGeneratorBase,_std::default_delete<cmFileListGeneratorBase>_> local_20;
  cmFileListGeneratorBase *local_18;
  cmFileListGeneratorBase *next_local;
  cmFileListGeneratorBase *this_local;
  
  local_18 = next;
  next_local = this;
  (*next->_vptr_cmFileListGeneratorBase[3])(&local_20);
  std::unique_ptr<cmFileListGeneratorBase,_std::default_delete<cmFileListGeneratorBase>_>::operator=
            (&this->Next,&local_20);
  std::unique_ptr<cmFileListGeneratorBase,_std::default_delete<cmFileListGeneratorBase>_>::
  ~unique_ptr(&local_20);
  pcVar1 = std::unique_ptr<cmFileListGeneratorBase,_std::default_delete<cmFileListGeneratorBase>_>::
           get(&this->Next);
  return pcVar1;
}

Assistant:

cmFileListGeneratorBase* cmFileListGeneratorBase::SetNext(
  cmFileListGeneratorBase const& next)
{
  this->Next = next.Clone();
  return this->Next.get();
}